

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddRanlibRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  string *psVar4;
  ulong uVar5;
  ostream *poVar6;
  allocator<char> local_89;
  string local_88;
  string *local_68;
  string *ranlib;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *toDestDirPath_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  local_28 = toDestDirPath;
  toDestDirPath_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == STATIC_LIBRARY) {
    pcVar3 = cmTarget::GetMakefile(this->Target->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"APPLE",&local_49);
    bVar1 = cmMakefile::IsOn(pcVar3,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pcVar3 = cmTarget::GetMakefile(this->Target->Target);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"CMAKE_RANLIB",&local_89);
      psVar4 = cmMakefile::GetRequiredDefinition(pcVar3,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      local_68 = psVar4;
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        poVar6 = ::operator<<((ostream *)toDestDirPath_local,
                              (cmScriptGeneratorIndent)this_local._4_4_);
        poVar6 = std::operator<<(poVar6,"execute_process(COMMAND \"");
        poVar6 = std::operator<<(poVar6,(string *)local_68);
        poVar6 = std::operator<<(poVar6,"\" \"");
        poVar6 = std::operator<<(poVar6,(string *)local_28);
        std::operator<<(poVar6,"\")\n");
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRanlibRule(std::ostream& os, Indent indent,
                                             const std::string& toDestDirPath)
{
  // Static libraries need ranlib on this platform.
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    return;
  }

  // Perform post-installation processing on the file depending
  // on its type.
  if (!this->Target->Target->GetMakefile()->IsOn("APPLE")) {
    return;
  }

  const std::string& ranlib =
    this->Target->Target->GetMakefile()->GetRequiredDefinition("CMAKE_RANLIB");
  if (ranlib.empty()) {
    return;
  }

  os << indent << "execute_process(COMMAND \"" << ranlib << "\" \""
     << toDestDirPath << "\")\n";
}